

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay_linux.hpp
# Opt level: O1

bool poll_stall_information(StallState *state)

{
  bool bVar1;
  int iVar2;
  FILE *pFVar3;
  char *pcVar4;
  int *piVar5;
  ulong uVar6;
  ulonglong uVar7;
  int32_t iVar8;
  ulong uVar9;
  timespec ts;
  timespec local_438 [64];
  
  pFVar3 = fopen("/proc/meminfo","r");
  if (pFVar3 == (FILE *)0x0) {
    if (Global::control_block != 0) {
      *(undefined4 *)(Global::control_block + 0xc8c) = 0xffffffff;
    }
LAB_00137a48:
    state->dirty_pages_mib = -1;
  }
  else {
    pcVar4 = fgets((char *)local_438,0x400,pFVar3);
    if (pcVar4 == (char *)0x0) {
      bVar1 = false;
    }
    else {
      bVar1 = false;
      do {
        if (local_438[0].tv_sec._4_2_ == 0x3a79 && (int)local_438[0].tv_sec == 0x74726944) {
          piVar5 = __errno_location();
          *piVar5 = 0;
          uVar6 = strtoll((char *)((long)&local_438[0].tv_sec + 6),(char **)0x0,10);
          if (*piVar5 == 0) {
            uVar9 = uVar6 + 0x3ff;
            if (-1 < (long)uVar6) {
              uVar9 = uVar6;
            }
            iVar8 = (int32_t)(uVar9 >> 10);
            state->dirty_pages_mib = iVar8;
            bVar1 = true;
            if (Global::control_block != 0) {
              *(int32_t *)(Global::control_block + 0xc8c) = iVar8;
            }
          }
        }
        pcVar4 = fgets((char *)local_438,0x400,pFVar3);
      } while (pcVar4 != (char *)0x0);
    }
    if (!(bool)(Global::control_block == 0 | bVar1)) {
      *(undefined4 *)(Global::control_block + 0xc8c) = 0xffffffff;
    }
    fclose(pFVar3);
    if (!bVar1) goto LAB_00137a48;
  }
  pFVar3 = fopen("/proc/pressure/io","r");
  if (pFVar3 != (FILE *)0x0) {
    pcVar4 = fgets((char *)local_438,0x400,pFVar3);
    if (pcVar4 != (char *)0x0) {
      if ((local_438[0].tv_sec._4_1_ == ' ' && (int)local_438[0].tv_sec == 0x656d6f73) &&
         (pcVar4 = strstr((char *)local_438,"total="), pcVar4 != (char *)0x0)) {
        piVar5 = __errno_location();
        *piVar5 = 0;
        uVar7 = strtoull(pcVar4 + 6,(char **)0x0,10);
        state->io_stalled_us = uVar7;
        iVar2 = *piVar5;
        fclose(pFVar3);
        if (iVar2 == 0) goto LAB_00137aa5;
        goto LAB_00137a9d;
      }
    }
    fclose(pFVar3);
  }
LAB_00137a9d:
  state->io_stalled_us = -1;
LAB_00137aa5:
  local_438[0].tv_sec = 0;
  local_438[0].tv_nsec = 0;
  iVar2 = clock_gettime(1,local_438);
  if (iVar2 == 0) {
    state->timestamp_ns = local_438[0].tv_sec * 1000000000 + local_438[0].tv_nsec;
  }
  return iVar2 == 0;
}

Assistant:

static bool poll_stall_information(StallState &state)
{
	if (!get_dirty_page_info(state))
		state.dirty_pages_mib = -1;
	if (!get_stall_info("/proc/pressure/io", state.io_stalled_us))
		state.io_stalled_us = -1;

	timespec ts = {};
	if (clock_gettime(CLOCK_MONOTONIC, &ts) != 0)
		return false;
	state.timestamp_ns = ts.tv_sec * 1000000000ll + ts.tv_nsec;
	return true;
}